

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_info_fwd.hpp
# Opt level: O2

error_info *
toml::make_error_info<>
          (error_info *__return_storage_ptr__,string *title,source_location *loc,string *msg)

{
  error_info ei;
  allocator<char> local_1a1;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  error_info local_140;
  source_location local_e8;
  error_info local_70;
  
  std::__cxx11::string::string
            (&local_160,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)title);
  source_location::source_location(&local_e8,loc);
  std::__cxx11::string::string
            (&local_180,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)msg);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"",&local_1a1);
  error_info::error_info(&local_140,(string *)&local_160,&local_e8,(string *)&local_180,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  source_location::~source_location(&local_e8);
  std::__cxx11::string::~string((string *)&local_160);
  error_info::error_info(&local_70,&local_140);
  error_info::error_info(__return_storage_ptr__,&local_70);
  error_info::~error_info(&local_70);
  error_info::~error_info(&local_140);
  return __return_storage_ptr__;
}

Assistant:

error_info make_error_info(
    std::string title, source_location loc, std::string msg, Ts&& ... tail)
{
    error_info ei(std::move(title), std::move(loc), std::move(msg));
    return detail::make_error_info_rec(ei, std::forward<Ts>(tail) ... );
}